

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall leveldb::Footer::EncodeTo(Footer *this,string *dst)

{
  long lVar1;
  size_type sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = dst->_M_string_length;
  BlockHandle::EncodeTo(&this->metaindex_handle_,dst);
  BlockHandle::EncodeTo(&this->index_handle_,dst);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(dst,0x28);
  PutFixed32(dst,0x8b80fb57);
  PutFixed32(dst,0xdb477524);
  if (dst->_M_string_length != sVar2 + 0x30) {
    __assert_fail("dst->size() == original_size + kEncodedLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/format.cc"
                  ,0x26,"void leveldb::Footer::EncodeTo(std::string *) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Footer::EncodeTo(std::string* dst) const {
  const size_t original_size = dst->size();
  metaindex_handle_.EncodeTo(dst);
  index_handle_.EncodeTo(dst);
  dst->resize(2 * BlockHandle::kMaxEncodedLength);  // Padding
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber & 0xffffffffu));
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber >> 32));
  assert(dst->size() == original_size + kEncodedLength);
  (void)original_size;  // Disable unused variable warning.
}